

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::LoggingStorage::GetSetting(Value *__return_storage_ptr__,ClientContext *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DatabaseInstance *this;
  LogManager *this_00;
  string local_c8;
  LogConfig local_a8;
  
  this = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  this_00 = DatabaseInstance::GetLogManager(this);
  LogManager::GetConfig(&local_a8,this_00);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  paVar1 = &local_a8.storage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.storage._M_dataplus._M_p == paVar1) {
    local_c8.field_2._8_8_ = local_a8.storage.field_2._8_8_;
  }
  else {
    local_c8._M_dataplus._M_p = local_a8.storage._M_dataplus._M_p;
  }
  local_c8._M_string_length = local_a8.storage._M_string_length;
  local_a8.storage._M_string_length = 0;
  local_a8.storage.field_2._M_local_buf[0] = '\0';
  local_a8.storage._M_dataplus._M_p = (pointer)paVar1;
  Value::Value(__return_storage_ptr__,&local_c8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  LogConfig::~LogConfig(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Value LoggingStorage::GetSetting(const ClientContext &context) {
	return context.db->GetLogManager().GetConfig().storage;
}